

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O2

rfc5444_result
schedule_end_message_cbs
          (rfc5444_reader_tlvblock_context *tlv_context,rfc5444_reader_tlvblock_consumer *first,
          rfc5444_reader_tlvblock_consumer *last,rfc5444_result result)

{
  rfc5444_result rVar1;
  
  tlv_context->type = RFC5444_CONTEXT_MESSAGE;
  while ((rfc5444_reader_tlvblock_consumer *)(last->_node).list.next != first) {
    if (((last->end_callback !=
          (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) &&
        (last->addrblock_consumer == false)) &&
       ((last->default_msg_consumer != false || (last->msg_id == tlv_context->msg_type)))) {
      tlv_context->consumer = last;
      rVar1 = (*last->end_callback)(tlv_context,result != RFC5444_OKAY);
      if (result < rVar1) {
        result = rVar1;
      }
    }
    last = (rfc5444_reader_tlvblock_consumer *)(last->_node).list.prev;
  }
  return result;
}

Assistant:

static enum rfc5444_result
schedule_end_message_cbs(struct rfc5444_reader_tlvblock_context *tlv_context,
  struct rfc5444_reader_tlvblock_consumer *first, struct rfc5444_reader_tlvblock_consumer *last,
  enum rfc5444_result result) {
  struct rfc5444_reader_tlvblock_consumer *consumer;
  enum rfc5444_result r;

  tlv_context->type = RFC5444_CONTEXT_MESSAGE;

  avl_for_element_range_reverse(first, last, consumer, _node) {
    if (consumer->end_callback && !consumer->addrblock_consumer &&
        (consumer->default_msg_consumer || consumer->msg_id == tlv_context->msg_type)) {
      tlv_context->consumer = consumer;
      r = consumer->end_callback(tlv_context, result != RFC5444_OKAY);
      if (r > result) {
        result = r;
      }
    }
  }
  return result;
}